

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status adios2sys::SystemTools::SetPermissions(string *file,mode_t mode,bool honor_umask)

{
  bool bVar1;
  __mode_t __mask;
  int iVar2;
  char *__file;
  byte in_DL;
  uint in_ESI;
  mode_t currentMask;
  string *in_stack_00000068;
  int in_stack_ffffffffffffffdc;
  undefined4 local_14;
  undefined8 local_8;
  
  bVar1 = PathExists(in_stack_00000068);
  if (bVar1) {
    local_14 = in_ESI;
    if ((in_DL & 1) != 0) {
      __mask = umask(0);
      umask(__mask);
      local_14 = (__mask ^ 0xffffffff) & in_ESI;
    }
    __file = (char *)std::__cxx11::string::c_str();
    iVar2 = chmod(__file,local_14);
    if (iVar2 < 0) {
      local_8 = Status::POSIX_errno();
    }
    else {
      local_8 = Status::Success();
    }
  }
  else {
    local_8 = Status::POSIX(in_stack_ffffffffffffffdc);
  }
  return local_8;
}

Assistant:

Status SystemTools::SetPermissions(std::string const& file, mode_t mode,
                                   bool honor_umask)
{
  if (!SystemTools::PathExists(file)) {
    return Status::POSIX(ENOENT);
  }
  if (honor_umask) {
    mode_t currentMask = umask(0);
    umask(currentMask);
    mode &= ~currentMask;
  }
#ifdef _WIN32
  if (_wchmod(Encoding::ToWindowsExtendedPath(file).c_str(), mode) < 0)
#else
  if (chmod(file.c_str(), mode) < 0)
#endif
  {
    return Status::POSIX_errno();
  }

  return Status::Success();
}